

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O0

void trico_fill_code_double(uint8_t **out,uint64_t *xor1,uint64_t *xor2,uint64_t *bcode)

{
  uint64_t uVar1;
  uint64_t uVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  uint local_30;
  uint32_t k;
  uint8_t bc;
  uint64_t *bcode_local;
  uint64_t *xor2_local;
  uint64_t *xor1_local;
  uint8_t **out_local;
  
  uVar1 = bcode[1];
  uVar2 = *bcode;
  pbVar3 = *out;
  *out = pbVar3 + 1;
  *pbVar3 = (byte)(uVar1 << 4) | (byte)uVar2;
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
    switch(bcode[local_30]) {
    case 0:
      break;
    case 1:
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 2:
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 3:
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 4:
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 5:
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x20);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 6:
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x28);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x20);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 7:
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x30);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x28);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x20);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 8:
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x38);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x30);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x28);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x20);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor1[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 9:
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 10:
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 0xb:
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 0xc:
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 0xd:
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x20);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 0xe:
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x28);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x20);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
      break;
    case 0xf:
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x30);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x28);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x20);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x18);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 0x10);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)(uVar1 >> 8);
      uVar1 = xor2[local_30];
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = (uint8_t)uVar1;
    }
  }
  return;
}

Assistant:

static inline void trico_fill_code_double(uint8_t** out, uint64_t* xor1, uint64_t* xor2, uint64_t* bcode)
  {
  uint8_t bc = (uint8_t)((bcode[1] << 4) | bcode[0]);

  *(*out)++ = bc;

  for (uint32_t k = 0; k < 2; ++k)
    {
    switch (bcode[k])
      {
      case 0:
      {
      break;
      }
      case 1:
      {
      *(*out)++ = (uint8_t)(xor1[k]);
      break;
      }
      case 2:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 3:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 16));
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 4:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 24));
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 5:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 32));
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 6:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 40));
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 7:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 48));
      *(*out)++ = (uint8_t)((xor1[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 8:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 56));
      *(*out)++ = (uint8_t)((xor1[k] >> 48) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 9:
      {
      *(*out)++ = (uint8_t)(xor2[k]);
      break;
      }
      case 10:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 11:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 16));
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 12:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 24));
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 13:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 32));
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 14:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 40));
      *(*out)++ = (uint8_t)((xor2[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 15:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 48));
      *(*out)++ = (uint8_t)((xor2[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      }
    }
  }